

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

positionTy * __thiscall positionTy::operator|=(positionTy *this,positionTy *pos)

{
  uint uVar1;
  LTError *this_00;
  double *pdVar2;
  positionTy *this_01;
  positionTy *ppVar3;
  positionTy *in_RSI;
  positionTy *in_RDI;
  double dVar4;
  double prev_rol;
  double prev_ptc;
  double prev_alt;
  double h;
  double in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff88;
  positionTy *local_70;
  double local_68;
  double local_60;
  
  if (((SUB21(in_RDI->f,1) >> 2 & 1) == (SUB21(in_RSI->f,1) >> 2 & 1)) &&
     ((SUB21(in_RDI->f,1) >> 3 & 1) == (SUB21(in_RSI->f,1) >> 3 & 1))) {
    heading(in_RDI);
    heading(in_RSI);
    dVar4 = HeadingAvg(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                       ,in_stack_ffffffffffffff70);
    pdVar2 = alt_m(in_RDI);
    uVar1 = std::isnan(*pdVar2);
    if ((uVar1 & 1) == 0) {
      pdVar2 = alt_m(in_RDI);
      local_60 = *pdVar2;
    }
    else {
      local_60 = alt_m(in_RSI);
    }
    pdVar2 = pitch(in_RDI);
    uVar1 = std::isnan(*pdVar2);
    if ((uVar1 & 1) == 0) {
      pdVar2 = pitch(in_RDI);
      local_68 = *pdVar2;
    }
    else {
      local_68 = pitch(in_RSI);
    }
    pdVar2 = roll(in_RDI);
    uVar1 = std::isnan(*pdVar2);
    if ((uVar1 & 1) == 0) {
      pdVar2 = roll(in_RDI);
      local_70 = (positionTy *)*pdVar2;
    }
    else {
      local_70 = (positionTy *)roll(in_RSI);
    }
    ppVar3 = in_RSI;
    this_01 = operator*=(in_RDI,(double)in_RDI->mergeCount);
    operator+=(this_01,ppVar3);
    in_RDI->mergeCount = in_RDI->mergeCount + 1;
    operator*=(in_RDI,1.0 / (double)in_RDI->mergeCount);
    pdVar2 = heading(in_RDI);
    *pdVar2 = dVar4;
    pdVar2 = alt_m(in_RDI);
    uVar1 = std::isnan(*pdVar2);
    if ((uVar1 & 1) != 0) {
      pdVar2 = alt_m(in_RDI);
      *pdVar2 = local_60;
    }
    pdVar2 = pitch(in_RDI);
    uVar1 = std::isnan(*pdVar2);
    if ((uVar1 & 1) != 0) {
      pdVar2 = pitch(in_RDI);
      *pdVar2 = local_68;
    }
    pdVar2 = roll(in_RDI);
    uVar1 = std::isnan(*pdVar2);
    if ((uVar1 & 1) != 0) {
      ppVar3 = local_70;
      pdVar2 = roll(in_RDI);
      *pdVar2 = (double)local_70;
      local_70 = ppVar3;
    }
    if (((ushort)in_RDI->f & 0x7f) == 0) {
      in_RDI->f = (posFlagsTy)((ushort)in_RDI->f & 0xff80 | (ushort)in_RSI->f & 0x7f);
    }
    if ((SUB21(in_RDI->f,1) & 3) != (SUB21(in_RSI->f,1) & 3)) {
      in_RDI->f = (posFlagsTy)((ushort)in_RDI->f & 0xfcff);
    }
    in_RDI->f = (posFlagsTy)((ushort)in_RDI->f & 0xff7f);
    in_RDI->f = (posFlagsTy)((ushort)in_RDI->f & 0xcfff);
    in_RDI->f = (posFlagsTy)((ushort)in_RDI->f & 0xbfff);
    in_RDI->edgeIdx = 0xffffffffffffffff;
    ppVar3 = normalize(local_70);
    return ppVar3;
  }
  this_00 = (LTError *)__cxa_allocate_exception(0x18);
  LTError::LTError(this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                   ,0x134,"operator|=",logFATAL,"ASSERT FAILED: %s",
                   "f.unitCoord == pos.f.unitCoord && f.unitAngle == pos.f.unitAngle");
  __cxa_throw(this_00,&LTError::typeinfo,LTError::~LTError);
}

Assistant:

positionTy& positionTy::operator |= (const positionTy& pos)
{
    LOG_ASSERT(f.unitCoord == pos.f.unitCoord && f.unitAngle == pos.f.unitAngle);
    // heading needs special treatment
    // (also removes nan value if one of the headings is nan)
    const double h = HeadingAvg(heading(), pos.heading(), mergeCount, pos.mergeCount);
    // take into account how many other objects made up the current pos! ("* count")

    // Special handling for possible NAN values: If NAN on either side then the other wins
    double prev_alt = std::isnan(alt_m()) ? pos.alt_m() : alt_m();
    double prev_ptc = std::isnan(pitch()) ? pos.pitch() : pitch();
    double prev_rol = std::isnan(roll())  ? pos.roll()  : roll();

	// previous implementation:    v = (v * mergeCount + pos.v) / (mergeCount+1);
    (*this *= mergeCount) += pos;
    ++mergeCount;
    *this *= 1.0 / mergeCount;

    heading() = h;
    
    // Handle NAN cases
    if (std::isnan(alt_m())) alt_m() = prev_alt;
    if (std::isnan(pitch())) pitch() = prev_ptc;
    if (std::isnan(roll()))  roll()  = prev_rol;

    // any special flight phase? shall survive
    // (if both pos have special flight phases then ours survives)
    if (!f.flightPhase)
        f.flightPhase = pos.f.flightPhase;
    
    // ground status: if different, then the new one is likely off ground,
    //                but we have it determined soon
    if (f.onGrnd != pos.f.onGrnd)
        f.onGrnd = GND_UNKNOWN;       // IsOnGnd() will return false for this!
    
    // Special Pos and other location flags need to be re-evaluated
    f.bHeadFixed = false;
    f.specialPos = SPOS_NONE;
    f.bCutCorner = false;
    edgeIdx      = EDGE_UNKNOWN;
    
    return normalize();
}